

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void unpack_weights_and_set_round_const
               (ConvolveParams *conv_params,int round_bits,int offset_bits,__m128i *res_sub_const,
               __m128i *round_bits_const,__m128i *wt)

{
  byte bVar1;
  undefined2 uVar2;
  short sVar3;
  undefined2 local_e0;
  undefined2 local_dc;
  byte local_bc;
  __m128i wt1;
  __m128i wt0;
  int w1;
  int w0;
  __m128i *wt_local;
  __m128i *round_bits_const_local;
  __m128i *res_sub_const_local;
  int offset_bits_local;
  int round_bits_local;
  ConvolveParams *conv_params_local;
  
  bVar1 = (char)offset_bits - (char)conv_params->round_1;
  sVar3 = -((short)(1 << (bVar1 & 0x1f)) + (short)(1 << (bVar1 - 1 & 0x1f)));
  (*res_sub_const)[0] = CONCAT26(sVar3,CONCAT24(sVar3,CONCAT22(sVar3,sVar3)));
  (*res_sub_const)[1] = CONCAT26(sVar3,CONCAT24(sVar3,CONCAT22(sVar3,sVar3)));
  local_bc = (byte)round_bits;
  uVar2 = (undefined2)((uint)(1 << (local_bc & 0x1f)) >> 1);
  (*round_bits_const)[0] = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2)));
  (*round_bits_const)[1] = CONCAT26(uVar2,CONCAT24(uVar2,CONCAT22(uVar2,uVar2)));
  local_dc = (undefined2)conv_params->fwd_offset;
  local_e0 = (undefined2)conv_params->bck_offset;
  *(undefined2 *)*wt = local_dc;
  *(undefined2 *)((long)*wt + 2) = local_e0;
  *(undefined2 *)((long)*wt + 4) = local_dc;
  *(undefined2 *)((long)*wt + 6) = local_e0;
  *(undefined2 *)(*wt + 1) = local_dc;
  *(undefined2 *)((long)*wt + 10) = local_e0;
  *(undefined2 *)((long)*wt + 0xc) = local_dc;
  *(undefined2 *)((long)*wt + 0xe) = local_e0;
  return;
}

Assistant:

static inline void unpack_weights_and_set_round_const(
    ConvolveParams *conv_params, const int round_bits, const int offset_bits,
    __m128i *res_sub_const, __m128i *round_bits_const, __m128i *wt) {
  *res_sub_const =
      _mm_set1_epi16(-(1 << (offset_bits - conv_params->round_1)) -
                     (1 << (offset_bits - conv_params->round_1 - 1)));
  *round_bits_const = _mm_set1_epi16(((1 << round_bits) >> 1));

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16((int16_t)w0);
  const __m128i wt1 = _mm_set1_epi16((int16_t)w1);
  *wt = _mm_unpacklo_epi16(wt0, wt1);
}